

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

void Gia_ManCountRanks_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vRoots,Vec_Int_t *vRanks,Vec_Int_t *vCands,int Rank
               )

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = (ulong)(uint)iObj;
  do {
    iVar3 = (int)uVar4;
    if (p->nTravIdsAlloc <= iVar3) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[iVar3] == p->nTravIds) {
      if ((iVar3 < 0) || (vRanks->nSize <= iVar3)) {
LAB_0056e444:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vRanks->pArray[uVar4] < Rank) {
        if (vCands->nSize <= iVar3) goto LAB_0056e3e7;
        vCands->pArray[uVar4] = 1;
      }
      return;
    }
    p->pTravIds[iVar3] = p->nTravIds;
    if ((iVar3 < 0) || (vRanks->nSize <= iVar3)) {
LAB_0056e3e7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    vRanks->pArray[uVar4] = Rank;
    if (p->nObjs <= iVar3) {
LAB_0056e425:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar2 = p->pObjs;
    uVar5 = (uint)*(undefined8 *)(pGVar2 + uVar4);
    if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
      if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
        uVar5 = (uint)((ulong)*(undefined8 *)(pGVar2 + uVar4) >> 0x20);
        if (p->vCis->nSize - p->nRegs <= (int)(uVar5 & 0x1fffffff)) {
          iVar3 = p->vCis->nSize;
          if ((int)(uVar5 & 0x1fffffff) < iVar3 - p->nRegs) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar1 = p->vCos->nSize;
          uVar5 = (iVar1 - iVar3) + (uVar5 & 0x1fffffff);
          if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) goto LAB_0056e444;
          iVar3 = p->vCos->pArray[uVar5];
          if ((-1 < (long)iVar3) && (iVar3 < p->nObjs)) {
            Vec_IntPush(vRoots,iVar3 - (*(uint *)(pGVar2 + iVar3) & 0x1fffffff));
            return;
          }
          goto LAB_0056e425;
        }
        if ((int)(uVar5 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
          return;
        }
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x143,
                    "void Gia_ManCountRanks_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    Gia_ManCountRanks_rec(p,iVar3 - (uVar5 & 0x1fffffff),vRoots,vRanks,vCands,Rank);
    uVar4 = (ulong)(iVar3 - (*(uint *)&pGVar2[uVar4].field_0x4 & 0x1fffffff));
  } while( true );
}

Assistant:

void Gia_ManCountRanks_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vRoots, Vec_Int_t * vRanks, Vec_Int_t * vCands, int Rank )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
    {
        if ( Vec_IntEntry(vRanks, iObj) < Rank )
            Vec_IntWriteEntry( vCands, iObj, 1 );
        return;
    }
    Gia_ObjSetTravIdCurrentId(p, iObj);
    Vec_IntWriteEntry( vRanks, iObj, Rank );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCountRanks_rec( p, Gia_ObjFaninId0(pObj, iObj), vRoots, vRanks, vCands, Rank );
        Gia_ManCountRanks_rec( p, Gia_ObjFaninId1(pObj, iObj), vRoots, vRanks, vCands, Rank );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( !Gia_ObjIsPi(p, pObj) )
        assert( 0 );
}